

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O0

long __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
::
to_usec<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>::posix_time_duration>
          (timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
           *this,posix_time_duration *d,long max_duration)

{
  int64_t iVar1;
  long in_RDX;
  int64_t usec;
  int64_t local_8;
  
  iVar1 = chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
          ::posix_time_duration::ticks((posix_time_duration *)0x24fa2d);
  if (iVar1 < 1) {
    local_8 = 0;
  }
  else {
    local_8 = chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
              ::posix_time_duration::total_microseconds((posix_time_duration *)0x24fa48);
    if (local_8 == 0) {
      local_8 = 1;
    }
    else if (in_RDX < local_8) {
      local_8 = in_RDX;
    }
  }
  return local_8;
}

Assistant:

long to_usec(const Duration& d, long max_duration) const
  {
    if (d.ticks() <= 0)
      return 0;
    int64_t usec = d.total_microseconds();
    if (usec == 0)
      return 1;
    if (usec > max_duration)
      return max_duration;
    return static_cast<long>(usec);
  }